

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O2

int PHF::init<std::__cxx11::string,false>
              (phf *phf,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
              size_t n,size_t l,size_t a,phf_seed_t seed)

{
  long *plVar1;
  ulong *puVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  void *pvVar6;
  void *pvVar7;
  uint32_t uVar8;
  size_t sVar9;
  string *psVar10;
  int *piVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  size_t sVar16;
  size_t sVar17;
  string *psVar18;
  string *psVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [32];
  void *local_a0;
  ulong local_98;
  string *local_90;
  phf *local_88;
  uint32_t *local_80;
  string *local_78;
  string *local_70;
  size_t local_68;
  void *local_60;
  size_t local_58;
  string *local_50;
  size_t local_48;
  void *local_40;
  phf_seed_t local_34;
  
  sVar16 = n + (n == 0);
  uVar12 = l + (l == 0);
  sVar17 = 100;
  if (a < 100) {
    sVar17 = a;
  }
  phf->nodiv = false;
  local_88 = phf;
  local_34 = seed;
  sVar9 = phf_primeup(((uVar12 + sVar16) - 1) / uVar12);
  local_58 = phf_primeup((sVar16 * 100) / (sVar17 + (sVar17 == 0)));
  if (local_58 == 0 || sVar9 == 0) {
    iVar15 = 0x22;
  }
  else {
    local_68 = sVar9;
    local_50 = (string *)n;
    psVar10 = (string *)calloc(sVar16,0x30);
    if ((psVar10 == (string *)0x0) ||
       (local_60 = calloc(local_68,8), psVar18 = local_50, psVar19 = psVar10,
       local_60 == (void *)0x0)) {
      local_40 = (void *)0x0;
      local_60 = (void *)0x0;
    }
    else {
      while (local_48 = sVar16, local_78 = psVar19, psVar19 = local_78, psVar18 != (string *)0x0) {
        std::__cxx11::string::string(local_c0,(string *)k);
        std::__cxx11::string::string((string *)&local_e0,local_c0);
        uVar8 = phf_g<std::__cxx11::string>(&local_e0,local_34);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_68;
        lVar13 = SUB168(ZEXT416(uVar8) % auVar4,0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string(local_c0);
        std::__cxx11::string::_M_assign(psVar10);
        *(int *)(psVar10 + 0x20) = SUB164(ZEXT416(uVar8) % auVar4,0);
        plVar1 = (long *)((long)local_60 + lVar13 * 8);
        *plVar1 = *plVar1 + 1;
        *(void **)(psVar10 + 0x28) = (void *)((long)local_60 + lVar13 * 8);
        k = k + 1;
        psVar10 = psVar10 + 0x30;
        psVar18 = psVar18 + -1;
        psVar19 = local_78;
        sVar16 = local_48;
      }
      qsort(local_78,local_48,0x30,phf_keycmp<std::__cxx11::string>);
      uVar12 = local_58 + 0x3f >> 6;
      local_40 = calloc(uVar12 * 2,8);
      psVar10 = psVar19;
      if (local_40 == (void *)0x0) {
        local_40 = (void *)0x0;
      }
      else {
        local_80 = (uint32_t *)calloc(local_68,4);
        if (local_80 != (uint32_t *)0x0) {
          local_a0 = (void *)((long)local_40 + uVar12 * 8);
          local_90 = psVar19 + (long)local_50 * 0x30;
          sVar16 = 0;
LAB_0016a37e:
          if ((psVar19 < local_90) && (lVar13 = **(long **)(psVar19 + 0x28), lVar13 != 0)) {
            local_48 = 0;
            local_98 = sVar16 & 0xffffffff;
            local_70 = psVar19;
            do {
              local_48 = local_48 + 1;
              local_50 = local_70 + lVar13 * 0x30;
              psVar10 = local_70;
              while( true ) {
                pvVar7 = local_40;
                sVar16 = local_48;
                psVar18 = local_70;
                if (local_50 <= psVar10) goto LAB_0016a4a9;
                std::__cxx11::string::string((string *)&local_140,psVar10);
                uVar8 = phf_f_mod_m<false,std::__cxx11::string>
                                  ((uint32_t)sVar16,&local_140,local_34,local_58);
                std::__cxx11::string::~string((string *)&local_140);
                pvVar6 = local_a0;
                uVar12 = (ulong)(uVar8 >> 6);
                uVar14 = 1L << ((byte)uVar8 & 0x3f);
                psVar18 = local_70;
                if (((*(ulong *)((long)pvVar7 + uVar12 * 8) >> ((ulong)uVar8 & 0x3f) & 1) != 0) ||
                   (uVar3 = *(ulong *)((long)local_a0 + uVar12 * 8), (uVar3 & uVar14) != 0)) break;
                *(ulong *)((long)local_a0 + uVar12 * 8) = uVar3 | uVar14;
                psVar10 = psVar10 + 0x30;
              }
              for (; sVar16 = local_48, psVar18 < local_50; psVar18 = psVar18 + 0x30) {
                std::__cxx11::string::string((string *)&local_120,psVar18);
                uVar8 = phf_f_mod_m<false,std::__cxx11::string>
                                  ((uint32_t)sVar16,&local_120,local_34,local_58);
                std::__cxx11::string::~string((string *)&local_120);
                bVar5 = (byte)uVar8 & 0x3f;
                puVar2 = (ulong *)((long)pvVar6 + (ulong)(uVar8 >> 6) * 8);
                *puVar2 = *puVar2 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
              }
              lVar13 = **(long **)(local_70 + 0x28);
            } while( true );
          }
          local_88->seed = local_34;
          local_88->r = local_68;
          local_88->m = local_58;
          local_88->g = local_80;
          local_88->d_max = sVar16 & 0xffffffff;
          local_88->g_op = PHF_G_UINT32_MOD_R;
          local_88->g_jmp = (void *)0x0;
          iVar15 = 0;
          psVar10 = local_78;
          goto LAB_0016a2ce;
        }
      }
    }
    piVar11 = __errno_location();
    iVar15 = *piVar11;
LAB_0016a2ce:
    free(local_40);
    free(local_60);
    free(psVar10);
  }
  return iVar15;
LAB_0016a4a9:
  for (; uVar8 = (uint32_t)local_48, psVar18 < local_50; psVar18 = psVar18 + 0x30) {
    std::__cxx11::string::string((string *)&local_100,psVar18);
    uVar8 = phf_f_mod_m<false,std::__cxx11::string>(uVar8,&local_100,local_34,local_58);
    std::__cxx11::string::~string((string *)&local_100);
    puVar2 = (ulong *)((long)local_40 + (ulong)(uVar8 >> 6) * 8);
    *puVar2 = *puVar2 | 1L << ((byte)uVar8 & 0x3f);
  }
  local_80[*(uint *)(local_70 + 0x20)] = uVar8;
  sVar16 = local_98;
  if (local_98 < local_48) {
    sVar16 = local_48;
  }
  psVar19 = local_70 + **(long **)(local_70 + 0x28) * 0x30;
  goto LAB_0016a37e;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}